

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::wait_for_all(Executor *this)

{
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  condition_variable *this_00;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffffd0;
  condition_variable local_18 [24];
  
  this_00 = local_18;
  std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffb8);
  std::condition_variable::wait<tf::Executor::wait_for_all()::_lambda()_1_>
            (this_00,in_RDI,in_stack_ffffffffffffffd0);
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  return;
}

Assistant:

inline void Executor::wait_for_all() {
#if __cplusplus >= TF_CPP20
  size_t n = _num_topologies.load(std::memory_order_acquire);
  while(n != 0) {
    _num_topologies.wait(n, std::memory_order_acquire);
    n = _num_topologies.load(std::memory_order_acquire);
  }
#else
  std::unique_lock<std::mutex> lock(_topology_mutex);
  _topology_cv.wait(lock, [&](){ return _num_topologies == 0; });
#endif
}